

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_NtkAddConstrOne(sat_solver *pSat,Vec_Int_t *vCover,int *pVars,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  ulong uVar4;
  int pLits [11];
  
  i = 0;
  if (nVars < 1) {
    nVars = 0;
  }
  do {
    if (vCover->nSize <= i) {
      return;
    }
    iVar1 = Vec_IntEntry(vCover,i);
    iVar3 = 0;
    for (uVar4 = 0; (uint)(nVars * 2) != uVar4; uVar4 = uVar4 + 2) {
      switch(iVar1 >> ((byte)uVar4 & 0x1f) & 3) {
      case 0:
        goto switchD_00398a43_caseD_0;
      case 1:
        iVar2 = 0;
        break;
      case 2:
        iVar2 = 1;
        break;
      case 3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x417,"void Ifn_NtkAddConstrOne(sat_solver *, Vec_Int_t *, int *, int)");
      }
      iVar2 = Abc_Var2Lit(*(int *)((long)pVars + uVar4 * 2),iVar2);
      pLits[iVar3] = iVar2;
      iVar3 = iVar3 + 1;
switchD_00398a43_caseD_0:
    }
    iVar3 = sat_solver_addclause(pSat,pLits,pLits + iVar3);
    i = i + 1;
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x41a,"void Ifn_NtkAddConstrOne(sat_solver *, Vec_Int_t *, int *, int)");
    }
  } while( true );
}

Assistant:

void Ifn_NtkAddConstrOne( sat_solver * pSat, Vec_Int_t * vCover, int * pVars, int nVars )
{
    int RetValue, k, c, Cube, Literal, nLits, pLits[IFN_INS];
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        nLits = 0;
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Cube >> (k << 1));
            if ( Literal == 1 )      // '0'  -> pos lit
                pLits[nLits++] = Abc_Var2Lit(pVars[k], 0);
            else if ( Literal == 2 ) // '1'  -> neg lit
                pLits[nLits++] = Abc_Var2Lit(pVars[k], 1);
            else if ( Literal != 0 )
                assert( 0 );
        }
        RetValue = Ifn_AddClause( pSat, pLits, pLits + nLits );
        assert( RetValue );
    }
}